

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjedi_index_impl.h
# Opt level: O2

void __thiscall
json::QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
step_one(QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
         *this,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *cost_matrix,unsigned_long *matrix_size,int *step)

{
  unsigned_long uVar1;
  pointer pvVar2;
  double *pdVar3;
  double dVar4;
  unsigned_long uVar5;
  unsigned_long c;
  unsigned_long uVar6;
  double dVar7;
  
  uVar1 = *matrix_size;
  pvVar2 = (cost_matrix->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
    pdVar3 = pvVar2[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar7 = *pdVar3;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      dVar4 = pdVar3[uVar6];
      if (dVar7 <= pdVar3[uVar6]) {
        dVar4 = dVar7;
      }
      dVar7 = dVar4;
    }
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      pdVar3[uVar6] = pdVar3[uVar6] - dVar7;
    }
  }
  *step = 2;
  return;
}

Assistant:

void QuickJEDITreeIndex<cost_matrixModel, TreeIndex>::step_one(
    std::vector<std::vector<double> >& cost_matrix,
    unsigned long& matrix_size,
    int& step)
{
  double min_in_row;
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    min_in_row = cost_matrix[r][0];
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      if (cost_matrix[r][c] < min_in_row)
      {
        min_in_row = cost_matrix[r][c];
      }
    }
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      cost_matrix[r][c] -= min_in_row;
    }
  }
  step = 2;
}